

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar1;
  FortranFormat FVar2;
  char *pcVar3;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Fortran_FORMAT",&local_39);
  pcVar3 = cmSourceFile::GetProperty(source,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  FVar2 = cmOutputConverter::GetFortranFormat(pcVar3);
  if (FVar2 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    std::__cxx11::string::string((string *)&local_38,"Fortran_FORMAT",&local_39);
    pcVar3 = cmGeneratorTarget::GetProperty(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    FVar2 = cmOutputConverter::GetFortranFormat(pcVar3);
  }
  if (FVar2 == FortranFormatFixed) {
    pcVar3 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else {
    if (FVar2 != FortranFormatFree) {
      return;
    }
    pcVar3 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  this_01 = this->Makefile;
  pcVar1 = this->LocalCommonGenerator;
  std::__cxx11::string::string((string *)&local_38,pcVar3,&local_39);
  pcVar3 = cmMakefile::GetDefinition(this_01,&local_38);
  (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(pcVar1,flags,pcVar3);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const char* srcfmt = source.GetProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    const char* tgtfmt = this->GeneratorTarget->GetProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = CM_NULLPTR;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetDefinition(var));
  }
}